

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  size_t in_R8;
  uint in_R9D;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if ((in_R9D & 1) == 0) {
    local_8 = HUF_decompress1X2_usingDTable_internal_default
                        (in_RSI,in_RDX,in_RCX,in_R8,
                         (HUF_DTable *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  }
  else {
    local_8 = HUF_decompress1X2_usingDTable_internal_bmi2
                        (in_RSI,in_RDX,in_RCX,in_R8,
                         (HUF_DTable *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  }
  return local_8;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}